

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

string * __thiscall
cmGlobalGenerator::IndexGeneratorTargetUniquely_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalGenerator *this,cmGeneratorTarget *gt)

{
  byte bVar1;
  size_t i;
  long lVar2;
  pointer pcVar3;
  mapped_type *ppcVar4;
  char buf [17];
  size_type __dnew;
  undefined1 uStack_57;
  char acStack_56 [6];
  undefined8 uStack_50;
  char local_48;
  cmGeneratorTarget *local_38;
  size_type local_30;
  
  local_38 = gt;
  lVar2 = 0;
  do {
    bVar1 = *(byte *)((long)&local_38 + lVar2);
    acStack_56[lVar2 * 2 + -1] = "0123456789abcdef"[bVar1 >> 4];
    acStack_56[lVar2 * 2] = "0123456789abcdef"[bVar1 & 0xf];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_30 = 0x11;
  pcVar3 = (pointer)std::__cxx11::string::_M_create
                              ((ulong *)__return_storage_ptr__,(ulong)&local_30);
  (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = local_30;
  pcVar3[0x10] = local_48;
  *(ulong *)pcVar3 = CONCAT71(_uStack_57,0x3a);
  *(undefined8 *)(pcVar3 + 8) = uStack_50;
  __return_storage_ptr__->_M_string_length = local_30;
  (__return_storage_ptr__->_M_dataplus)._M_p[local_30] = '\0';
  ppcVar4 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->GeneratorTargetSearchIndex,__return_storage_ptr__);
  *ppcVar4 = gt;
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::IndexGeneratorTargetUniquely(
  cmGeneratorTarget const* gt)
{
  // Use the pointer value to uniquely identify the target instance.
  // Use a ":" prefix to avoid conflict with project-defined targets.
  // We must satisfy cmGeneratorExpression::IsValidTargetName so use no
  // other special characters.
  char buf[1 + sizeof(gt) * 2];
  char* b = buf;
  *b++ = ':';
  for (size_t i = 0; i < sizeof(gt); ++i) {
    unsigned char const c = reinterpret_cast<unsigned char const*>(&gt)[i];
    *b++ = hexDigits[(c & 0xf0) >> 4];
    *b++ = hexDigits[(c & 0x0f)];
  }
  std::string id(buf, sizeof(buf));
  // We internally index pointers to non-const generator targets
  // but our callers only have pointers to const generator targets.
  // They will give up non-const privileges when looking up anyway.
  this->GeneratorTargetSearchIndex[id] = const_cast<cmGeneratorTarget*>(gt);
  return id;
}